

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.c
# Opt level: O0

size_t rtosc_scan_arg_val(char *src,rtosc_arg_val_t *arg,size_t nargs,char *buffer_for_strings,
                         size_t *bufsize,size_t args_before,int follow_ellipsis)

{
  uint8_t *puVar1;
  char cVar2;
  uint8_t uVar3;
  int iVar4;
  uint uVar5;
  int32_t iVar6;
  rtosc_arg_val_t *prVar7;
  char *pcVar8;
  ushort **ppuVar9;
  size_t sVar10;
  uint8_t *in_RCX;
  rtosc_arg_val_t *arg_00;
  long lVar11;
  long in_RDX;
  uint8_t *puVar12;
  rtosc_arg_val_t *in_RSI;
  uint8_t *in_RDI;
  long *in_R8;
  size_t *in_R9;
  bool bVar13;
  int unaff_retaddr;
  int in_stack_00000008;
  int32_t num;
  _Bool has_delta;
  _Bool llhsarg_is_useless;
  rtosc_arg_val_t *llhsarg;
  rtosc_arg_val_t tmp_3;
  int infinite_range;
  rtosc_arg_val_t lhsarg;
  size_t zero;
  rtosc_arg_val_t rhs;
  rtosc_arg_val_t delta;
  char *src2;
  char *after_num;
  char *fmtstr;
  _Bool repeat_once;
  char type;
  char bytes16 [16];
  uint64_t secfracs;
  float secfracsf;
  tm m_tm;
  int args_scanned_1;
  size_t tmp_2;
  size_t old_bufsize;
  int rd_2;
  int multiplier;
  int rd_1;
  int32_t tmp_1;
  int32_t i_2;
  size_t args_scanned;
  size_t i_1;
  char arrtype;
  size_t last_bufsize;
  rtosc_arg_val_t *start_arg;
  int32_t num_read;
  size_t i;
  int32_t tmp [4];
  _Bool cont;
  char *dest;
  char *src_backup;
  char *start;
  int rd;
  _func_int_int *in_stack_fffffffffffffdd8;
  rtosc_arg_val_t *in_stack_fffffffffffffde0;
  tm_conflict *in_stack_fffffffffffffde8;
  rtosc_arg_val_t *in_stack_fffffffffffffdf0;
  undefined7 in_stack_fffffffffffffdf8;
  undefined1 in_stack_fffffffffffffdff;
  rtosc_arg_val_t *local_200;
  undefined8 in_stack_fffffffffffffe08;
  rtosc_arg_val_t *in_stack_fffffffffffffe10;
  undefined8 in_stack_fffffffffffffe18;
  int ith;
  undefined7 in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe27;
  uint in_stack_fffffffffffffe2c;
  int in_stack_fffffffffffffe4c;
  rtosc_arg_val_t *in_stack_fffffffffffffe50;
  rtosc_arg_val_t *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  rtosc_arg_val_t *prVar14;
  uint8_t *local_148;
  uint64_t local_118;
  undefined1 local_10c [4];
  undefined4 local_108;
  undefined4 local_104;
  undefined4 local_100;
  undefined1 auStack_fc [4];
  int local_f8;
  int local_f4 [10];
  int local_cc;
  size_t local_c8;
  long local_c0;
  int local_b4;
  undefined1 local_b0 [4];
  int local_ac;
  undefined1 local_a8 [4];
  int local_a4;
  long local_a0;
  long local_98;
  char local_89;
  long local_88;
  rtosc_arg_val_t *local_80;
  int local_74;
  ulong local_70;
  undefined4 local_68;
  undefined1 auStack_64 [4];
  undefined1 auStack_60 [4];
  undefined1 auStack_5c [11];
  undefined1 local_51;
  uint8_t *local_50;
  uint8_t *local_48;
  uint8_t *local_40;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar15;
  uint8_t *local_8;
  
  iVar15 = 0;
  prVar7 = (rtosc_arg_val_t *)(in_RDX + -1);
  arg_00 = (rtosc_arg_val_t *)(ulong)((int)(char)*in_RDI - 0x22);
  local_40 = in_RDI;
  switch(arg_00) {
  case (rtosc_arg_val_t *)0x0:
    local_8 = in_RDI + 1;
    local_50 = in_RCX;
    while( true ) {
      while (*local_8 != '\"') {
        *in_R8 = *in_R8 + -1;
        if (*local_8 == '\\') {
          uVar3 = get_escaped_char(local_8[1],0);
          *local_50 = uVar3;
          local_8 = local_8 + 2;
        }
        else {
          *local_50 = *local_8;
          local_8 = local_8 + 1;
        }
        local_50 = local_50 + 1;
      }
      bVar13 = local_8[1] == '\\';
      if (!bVar13) break;
      skip_fmt((char **)in_stack_fffffffffffffde0,(char *)in_stack_fffffffffffffdd8);
      local_51 = bVar13;
    }
    *local_50 = '\0';
    *in_R8 = *in_R8 + -1;
    (in_RSI->val).d = (double)in_RCX;
    if (local_8[1] == 'S') {
      *in_R8 = *in_R8 + -1;
      in_RSI->type = 'S';
      local_51 = bVar13;
      local_8 = local_8 + 2;
    }
    else {
      in_RSI->type = 's';
      local_51 = bVar13;
      local_8 = local_8 + 1;
    }
    break;
  case (rtosc_arg_val_t *)0x1:
    in_RSI->type = 'r';
    __isoc99_sscanf(in_RDI + 1,"%x",&in_RSI->val);
    local_8 = in_RDI + 9;
    break;
  default:
    iVar4 = is_range_multiplier(&in_stack_fffffffffffffde0->type);
    if (iVar4 == 0) {
      local_8 = in_RDI;
      if ((*in_RDI == '_') ||
         (ppuVar9 = __ctype_b_loc(), ((*ppuVar9)[(int)(char)*in_RDI] & 0x400) != 0)) {
        in_RSI->type = 'S';
        (in_RSI->val).s = (char *)in_RCX;
        while( true ) {
          bVar13 = true;
          if (*local_8 != '_') {
            ppuVar9 = __ctype_b_loc();
            bVar13 = ((*ppuVar9)[(int)(char)*local_8] & 8) != 0;
          }
          if (!bVar13) break;
          *in_R8 = *in_R8 + -1;
          *in_RCX = *local_8;
          in_RCX = in_RCX + 1;
          local_8 = local_8 + 1;
        }
        *in_R8 = *in_R8 + -1;
        *in_RCX = '\0';
        in_RCX = in_RCX + 1;
        in_stack_fffffffffffffe27 = 0;
      }
      else if ((((*in_RDI == '\0') || (in_RDI[1] == '\0')) || (in_RDI[2] == '\0')) ||
              ((in_RDI[3] == '\0' || (in_RDI[4] != '-')))) {
        in_RSI->type = '\0';
        bVar13 = false;
        do {
          iVar15 = 0;
          scanf_fmtstr_scan(&in_stack_fffffffffffffdf0->type,(char *)in_stack_fffffffffffffde8,
                            &in_stack_fffffffffffffde0->type);
          if (in_RSI->type == '\0') {
            in_RSI->type = '\0';
          }
          in_stack_fffffffffffffe18 = 0;
          local_8 = local_8 + iVar15;
          if (bVar13) {
            skip_fmt((char **)in_stack_fffffffffffffde0,(char *)in_stack_fffffffffffffdd8);
            bVar13 = false;
          }
          else {
            skip_while((char **)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
            if (*local_8 == '(') {
              local_8 = local_8 + 1;
              skip_while((char **)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
              bVar13 = true;
            }
          }
        } while (bVar13);
      }
      else {
        (in_RSI->val).d = 0.0;
        local_100 = 0;
        local_104 = 0;
        local_108 = 0;
        __isoc99_sscanf(in_RDI,"%4d-%2d-%2d%n",local_f4,&local_f8,auStack_fc,
                        &stack0xffffffffffffffcc);
        local_8 = in_RDI + iVar15;
        iVar15 = 0;
        __isoc99_sscanf(local_8," %2d:%2d%n",&local_100,&local_104,&stack0xffffffffffffffcc);
        if (iVar15 != 0) {
          local_8 = local_8 + iVar15;
        }
        iVar15 = 0;
        __isoc99_sscanf(local_8,":%2d%n",&local_108,&stack0xffffffffffffffcc);
        if (iVar15 != 0) {
          local_8 = local_8 + iVar15;
        }
        iVar4 = skip_fmt((char **)in_stack_fffffffffffffde0,(char *)in_stack_fffffffffffffdd8);
        if (iVar4 == 0) {
          if (*local_8 == '.') {
            __isoc99_sscanf(local_8,"%f%n",local_10c,&stack0xffffffffffffffcc);
            local_8 = local_8 + iVar15;
            local_118 = rtosc_float2secfracs((float)((ulong)arg_00 >> 0x20));
          }
          else {
            local_118 = 0;
          }
        }
        else {
          __isoc99_sscanf(local_8," ... + 0x%8lxp-32 s )%n",&local_118,&stack0xffffffffffffffcc);
          local_8 = local_8 + iVar15;
        }
        local_f4[0] = local_f4[0] + -0x76c;
        local_f8 = local_f8 + -1;
        rtosc_arg_val_from_params
                  (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                   (uint64_t)in_stack_fffffffffffffde0);
      }
    }
    else {
      local_b4 = 0;
      __isoc99_sscanf(in_RDI,"%dx%n",local_b0,&local_b4);
      lVar11 = (long)local_b4;
      in_RSI->type = '-';
      iVar6 = (int32_t)((ulong)in_stack_fffffffffffffdd8 >> 0x20);
      rtosc_av_rep_num_set(in_stack_fffffffffffffde0,iVar6);
      rtosc_av_rep_has_delta_set(in_stack_fffffffffffffde0,iVar6);
      prVar14 = in_RSI + 1;
      local_c0 = *in_R8;
      local_c8 = rtosc_scan_arg_val(&prVar14->type,prVar7,(size_t)in_RCX,(char *)in_R8,in_R9,
                                    CONCAT44(iVar15,in_stack_ffffffffffffffc8),unaff_retaddr);
      in_RCX = in_RCX + (local_c0 - *in_R8);
      local_cc = next_arg_offset(in_stack_fffffffffffffde0);
      prVar7 = (rtosc_arg_val_t *)((long)prVar7 - (long)local_cc);
      in_RSI = prVar14 + local_cc;
      local_8 = in_RDI + local_c8 + lVar11;
    }
    break;
  case (rtosc_arg_val_t *)0x5:
    in_RSI->type = 'c';
    local_8 = in_RDI + 1;
    if (in_RDI[1] == '\\') {
      if ((in_RDI[3] == '\0') ||
         (ppuVar9 = __ctype_b_loc(), ((*ppuVar9)[(int)(char)in_RDI[3]] & 0x2000) != 0)) {
        (in_RSI->val).i = 0x5c;
      }
      else {
        local_8 = in_RDI + 2;
        cVar2 = get_escaped_char(in_RDI[2],1);
        *(int *)&in_RSI->val = (int)cVar2;
      }
    }
    else {
      *(int *)&in_RSI->val = (int)(char)*local_8;
    }
    local_8 = local_8 + 2;
    break;
  case (rtosc_arg_val_t *)0x20:
    in_RSI->type = 'b';
    __isoc99_sscanf(in_RDI,"BLOB [ %i %n",&in_RSI->val,&stack0xffffffffffffffcc);
    if (iVar15 == 0) {
      local_8 = (uint8_t *)
                parse_identifier(&in_stack_fffffffffffffdf0->type,
                                 (rtosc_arg_val_t *)in_stack_fffffffffffffde8,
                                 &in_stack_fffffffffffffde0->type,
                                 (size_t *)in_stack_fffffffffffffdd8);
    }
    else {
      local_8 = in_RDI + iVar15;
      *in_R8 = *in_R8 - (long)(in_RSI->val).i;
      (in_RSI->val).b.data = in_RCX;
      for (local_a4 = 0; local_a4 < (in_RSI->val).i; local_a4 = local_a4 + 1) {
        __isoc99_sscanf(local_8,"0x%x %n",local_a8,&local_ac);
        (in_RSI->val).b.data[local_a4] = local_a8[0];
        local_8 = local_8 + local_ac;
      }
      local_8 = local_8 + 1;
    }
    break;
  case (rtosc_arg_val_t *)0x2b:
    iVar4 = strncmp("MIDI",(char *)in_RDI,4);
    if ((iVar4 == 0) &&
       ((ppuVar9 = __ctype_b_loc(), ((*ppuVar9)[(int)(char)in_RDI[4]] & 0x2000) != 0 ||
        (in_RDI[4] == '[')))) {
      in_RSI->type = 'm';
      __isoc99_sscanf(in_RDI,"MIDI [ 0x%x 0x%x 0x%x 0x%x ]%n",&local_68,auStack_64,auStack_60,
                      auStack_5c,&stack0xffffffffffffffcc);
      for (local_70 = 0; local_8 = in_RDI + iVar15, local_70 < 4; local_70 = local_70 + 1) {
        (in_RSI->val).m[local_70] = (uint8_t)*(undefined4 *)(auStack_64 + local_70 * 4 + -4);
      }
    }
    else {
      local_8 = (uint8_t *)
                parse_identifier(&in_stack_fffffffffffffdf0->type,
                                 (rtosc_arg_val_t *)in_stack_fffffffffffffde8,
                                 &in_stack_fffffffffffffde0->type,
                                 (size_t *)in_stack_fffffffffffffdd8);
    }
    break;
  case (rtosc_arg_val_t *)0x39:
    local_80 = in_RSI;
    local_8 = in_RDI;
    do {
      ppuVar9 = __ctype_b_loc();
      puVar12 = local_8 + 1;
      puVar1 = local_8 + 1;
      local_8 = puVar12;
    } while (((*ppuVar9)[(int)(char)*puVar1] & 0x2000) != 0);
    local_74 = 0;
    prVar14 = local_80 + 1;
    local_89 = ' ';
    local_98 = 0;
    while( true ) {
      iVar6 = (int32_t)((ulong)in_stack_fffffffffffffdd8 >> 0x20);
      uVar5 = in_stack_fffffffffffffe2c & 0xffffff;
      if ((local_8 != (uint8_t *)0x0) &&
         (uVar5 = in_stack_fffffffffffffe2c & 0xffffff, *local_8 != '\0')) {
        uVar5 = CONCAT13(*local_8 != ']',(int3)in_stack_fffffffffffffe2c);
      }
      in_stack_fffffffffffffe2c = uVar5;
      if ((char)(in_stack_fffffffffffffe2c >> 0x18) == '\0') break;
      local_88 = *in_R8;
      in_stack_fffffffffffffdd8 = (_func_int_int *)CONCAT44(iVar6,1);
      sVar10 = rtosc_scan_arg_val(&prVar14->type,prVar7,(size_t)in_RCX,(char *)in_R8,in_R9,
                                  CONCAT44(iVar15,in_stack_ffffffffffffffc8),unaff_retaddr);
      local_8 = local_8 + sVar10;
      local_89 = prVar14->type;
      if (local_89 == '-') {
        iVar6 = rtosc_av_rep_has_delta((rtosc_arg_val_t *)0x11f924);
        if (iVar6 == 0) {
          local_89 = prVar14[1].type;
        }
        else {
          local_89 = prVar14[2].type;
        }
      }
      iVar4 = next_arg_offset(in_stack_fffffffffffffde0);
      local_a0 = (long)iVar4;
      prVar7 = (rtosc_arg_val_t *)((long)prVar7 - local_a0);
      prVar14 = prVar14 + local_a0;
      local_74 = local_74 + iVar4;
      while (ppuVar9 = __ctype_b_loc(), ((*ppuVar9)[(int)(char)*local_8] & 0x2000) != 0) {
        local_8 = local_8 + 1;
      }
      in_RCX = in_RCX + (local_88 - *in_R8);
      local_98 = local_98 + 1;
    }
    local_80->type = 'a';
    rtosc_av_arr_type_set
              (in_stack_fffffffffffffde0,(char)((ulong)in_stack_fffffffffffffdd8 >> 0x38));
    rtosc_av_arr_len_set(in_stack_fffffffffffffde0,iVar6);
    in_RSI = local_80;
    local_8 = local_8 + 1;
    break;
  case (rtosc_arg_val_t *)0x44:
  case (rtosc_arg_val_t *)0x47:
  case (rtosc_arg_val_t *)0x4c:
  case (rtosc_arg_val_t *)0x52:
    local_48 = in_RDI;
    pcVar8 = skip_word((char *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
                       (char **)in_stack_fffffffffffffdf0);
    if ((pcVar8 == (char *)0x0) &&
       (pcVar8 = skip_word((char *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
                           (char **)in_stack_fffffffffffffdf0), pcVar8 == (char *)0x0)) {
      pcVar8 = skip_word((char *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
                         (char **)in_stack_fffffffffffffdf0);
      if ((pcVar8 == (char *)0x0) &&
         (pcVar8 = skip_word((char *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
                             (char **)in_stack_fffffffffffffdf0), pcVar8 == (char *)0x0)) {
        pcVar8 = skip_word((char *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
                           (char **)in_stack_fffffffffffffdf0);
        if ((pcVar8 == (char *)0x0) &&
           (pcVar8 = skip_word((char *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8)
                               ,(char **)in_stack_fffffffffffffdf0), pcVar8 == (char *)0x0)) {
          local_8 = (uint8_t *)
                    parse_identifier(&in_stack_fffffffffffffdf0->type,
                                     (rtosc_arg_val_t *)in_stack_fffffffffffffde8,
                                     &in_stack_fffffffffffffde0->type,
                                     (size_t *)in_stack_fffffffffffffdd8);
        }
        else {
          iVar4 = toupper((int)(char)*local_48);
          in_RSI->type = (char)iVar4;
          local_8 = in_RDI;
        }
      }
      else {
        iVar4 = toupper((int)(char)*local_48);
        in_RSI->type = (char)iVar4;
        (in_RSI->val).T = in_RDI[-2] == 'u';
        local_8 = in_RDI;
      }
    }
    else {
      rtosc_arg_val_immediatelly(in_RSI);
      local_8 = in_RDI;
    }
  }
  local_148 = local_8;
  while (ppuVar9 = __ctype_b_loc(), ((*ppuVar9)[(int)(char)*local_148] & 0x2000) != 0) {
    local_148 = local_148 + 1;
  }
  if ((in_stack_00000008 != 0) && (iVar4 = strncmp((char *)local_148,"...",3), iVar4 == 0)) {
    prVar14 = *(rtosc_arg_val_t **)in_RSI;
    local_8 = local_148 + 2;
    do {
      ppuVar9 = __ctype_b_loc();
      ith = (int)((ulong)in_stack_fffffffffffffe18 >> 0x20);
      iVar4 = (int)((ulong)in_stack_fffffffffffffe08 >> 0x20);
      puVar12 = local_8 + 1;
      puVar1 = local_8 + 1;
      local_8 = puVar12;
    } while (((*ppuVar9)[(int)(char)*puVar1] & 0x2000) != 0);
    uVar5 = (uint)(*puVar12 == ']');
    if (uVar5 == 0) {
      sVar10 = rtosc_scan_arg_val(&in_RSI->type,prVar7,(size_t)in_RCX,(char *)in_R8,in_R9,
                                  CONCAT44(iVar15,in_stack_ffffffffffffffc8),unaff_retaddr);
      local_8 = puVar12 + sVar10;
    }
    if (((in_R9 < (size_t *)0x3) || (in_RSI[-3].type != '-')) ||
       (iVar6 = rtosc_av_rep_has_delta((rtosc_arg_val_t *)0x120545), iVar6 == 0)) {
      local_200 = in_RSI + -1;
    }
    else {
      iVar4 = (int)((ulong)(in_RSI + -3) >> 0x20);
      rtosc_av_rep_num((rtosc_arg_val_t *)0x12056c);
      local_200 = rtosc_arg_val_range_arg
                            ((rtosc_arg_val_t *)
                             CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),ith,
                             in_stack_fffffffffffffe10);
    }
    bVar13 = true;
    prVar7 = local_200;
    if (in_R9 != (size_t *)0x0) {
      bVar13 = true;
      if ((char)prVar14 != '-') {
        iVar15 = types_match(local_200->type,(char)prVar14);
        bVar13 = true;
        if (iVar15 != 0) {
          iVar15 = rtosc_arg_vals_cmp_single
                             ((rtosc_arg_val_t *)CONCAT44(uVar5,in_stack_fffffffffffffe60),
                              in_stack_fffffffffffffe58,
                              (rtosc_cmp_options *)in_stack_fffffffffffffe50);
          bVar13 = iVar15 == 0;
        }
      }
    }
    iVar15 = (int)prVar7;
    if ((uVar5 == 0) || (!bVar13)) {
      delta_from_arg_vals(prVar14,(rtosc_arg_val_t *)CONCAT44(uVar5,in_stack_fffffffffffffe60),
                          in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                          in_stack_fffffffffffffe4c);
    }
    insert_arg_range(arg_00,in_stack_fffffffffffffe2c,
                     (rtosc_arg_val_t *)
                     CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),ith,local_200,
                     iVar4,iVar15);
  }
  return (long)local_8 - (long)local_40;
}

Assistant:

size_t rtosc_scan_arg_val(const char* src,
                          rtosc_arg_val_t *arg, size_t nargs,
                          char* buffer_for_strings, size_t* bufsize,
                          size_t args_before, int follow_ellipsis)
{
    int rd = 0;
    const char* start = src;
    assert(nargs);
    --nargs;
    switch(*src)
    {
        case 't':
        case 'f':
        case 'n':
        case 'i':
        {
            const char* src_backup = src;
            // timestamps "immediately" or "now"?
            if(skip_word("immediately", &src) || skip_word("now", &src))
            {
                rtosc_arg_val_immediatelly(arg);
            }
            else if(skip_word("true", &src)  ||
                    skip_word("false", &src) )
            {
                arg->type = toupper(*src_backup);
                arg->val.T = (src[-2] == 'u');
            }
            else if(skip_word("nil", &src)   ||
                    skip_word("inf", &src))
            {
                arg->type = toupper(*src_backup);
            }
            else
            {
                // no reserved keyword => identifier
                src = parse_identifier(src, arg, buffer_for_strings, bufsize);
            }
            break;
        }
        case '#':
        {
            arg->type = 'r';
            sscanf(++src, "%x", &arg->val.i);
            src+=8;
            break;
        }
        case '\'':
            // type 1: '<noslash>' => normal char
            // type 2: '\<noquote>' => escaped char
            // type 3: '\'' => escaped quote
            // type 4: '\'<isspace> => mistyped backslash
            arg->type = 'c';
            if(*++src == '\\')
            {
                if(src[2] && !isspace(src[2])) // escaped and 4 chars
                    arg->val.i = get_escaped_char(*++src, true);
                else // escaped, but only 3 chars: type 4
                    arg->val.i = '\\';
            }
            else // non-escaped
                arg->val.i = *src;
            src+=2;
            break;
        case '"':
        {
            ++src; // skip obligatory '"'
            char* dest = buffer_for_strings;
            bool cont;
            do
            {
                while(*src != '"')
                {
                    (*bufsize)--;
                    assert(*bufsize);
                    if(*src == '\\') {
                        *dest++ = get_escaped_char(*++src, false);
                        ++src;
                    }
                    else
                        *dest++ = *src++;
                }
                if(src[1] == '\\')
                {
                    skip_fmt(&src, "\"\\ \"%n");
                    cont = true;
                }
                else
                    cont = false;
            } while (cont);
            *dest = 0;
            ++src; // skip final '"'
            (*bufsize)--;
            arg->val.s = buffer_for_strings;
            if(*src == 'S')
            {
                ++src;
                (*bufsize)--;
                arg->type = 'S';
            }
            else
                arg->type = 's';
            break;
        }
        case 'M':
        {
            if(!strncmp("MIDI", src, 4) && (isspace(src[4]) || src[4] == '['))
            {
                arg->type = 'm';
                int32_t tmp[4];
                sscanf(src, "MIDI [ 0x%"PRIx32" 0x%"PRIx32
                                  " 0x%"PRIx32" 0x%"PRIx32" ]%n",
                       tmp, tmp + 1, tmp + 2, tmp + 3, &rd); src+=rd;
                for(size_t i = 0; i < 4; ++i)
                    arg->val.m[i] = tmp[i]; // copy to 8 bit array
            }
            else
                src = parse_identifier(src, arg, buffer_for_strings, bufsize);
            break;
        }
        case '[':
        {
            while(isspace(*++src));
            int32_t num_read = 0;

            rtosc_arg_val_t* start_arg = arg++;

            size_t last_bufsize;

            char arrtype = ' ';
            for(size_t i = 0; src && *src && *src != ']'; ++i)
            {
                last_bufsize = *bufsize;

                src += rtosc_scan_arg_val(src, arg, nargs,
                                          buffer_for_strings, bufsize, i, 1);
                arrtype = arg->type;
                if(arrtype == '-')
                    arrtype = rtosc_av_rep_has_delta(arg) ? arg[2].type : arg[1].type;

                size_t args_scanned = next_arg_offset(arg);
                nargs -= args_scanned;
                arg += args_scanned;
                num_read += args_scanned;

                for( ; isspace(*src); ++src) ;

                buffer_for_strings += (last_bufsize - *bufsize);
                // TODO: allow comments in arrays, blobs, midi?
            }

            ++src; // ']'
            start_arg->type = 'a';
            rtosc_av_arr_type_set(start_arg, arrtype);
            rtosc_av_arr_len_set(start_arg, num_read);

            arg = start_arg; // invariant: arg is back at the start
            break;
        }
        case 'B': // blob
        {
            arg->type = 'b';
            sscanf(src, "BLOB [ %"PRIi32" %n", &arg->val.b.len, &rd);
            if(rd)
            {
                src +=rd;

                assert(*bufsize >= (size_t)arg->val.b.len);
                *bufsize -= (size_t)arg->val.b.len;
                arg->val.b.data = (uint8_t*)buffer_for_strings;
                for(int32_t i = 0; i < arg->val.b.len; ++i)
                {
                    int32_t tmp;
                    int rd;
                    sscanf(src, "0x%x %n", &tmp, &rd);
                    arg->val.b.data[i] = tmp;
                    src+=rd;
                }

                ++src; // skip ']'
            }
            else
                src = parse_identifier(src, arg, buffer_for_strings, bufsize);
            break;
        }
        default:
            // nx... ? (n > 0)
            if(is_range_multiplier(src))
            {
                // collect information for range_arg
                int multiplier, rd = 0;
                sscanf(src, "%dx%n", &multiplier, &rd);
                src += rd;
                arg->type = '-';
                rtosc_av_rep_num_set(arg, multiplier);
                rtosc_av_rep_has_delta_set(arg, 0);

                ++arg;
                // read value-arg
                size_t old_bufsize = *bufsize;
                size_t tmp = rtosc_scan_arg_val(src, arg, nargs,
                                                buffer_for_strings, bufsize,
                                                0, 0);
                buffer_for_strings += old_bufsize - *bufsize;
                int args_scanned = next_arg_offset(arg);
                nargs -= args_scanned;
                arg += args_scanned;
                src += tmp;
            }
            // is it an identifier?
            else if(*src == '_' || isalpha(*src))
            {
                arg->type = 'S';
                arg->val.s = buffer_for_strings;
                for(; *src == '_' || isalnum(*src); ++src)
                {
                    assert(*bufsize);
                    (*bufsize)--;
                    *buffer_for_strings = *src;
                    ++buffer_for_strings;
                }
                assert(*bufsize);
                (*bufsize)--;
                *buffer_for_strings = 0;
                ++buffer_for_strings;
            }
            // "YYYY-" => it's a date
            else if(src[0] && src[1] && src[2] && src[3] && src[4] == '-')
            {
                arg->val.t = 0;

                struct tm m_tm;
                m_tm.tm_hour = 0;
                m_tm.tm_min = 0;
                m_tm.tm_sec = 0;
                sscanf(src, "%4d-%2d-%2d%n",
                       &m_tm.tm_year, &m_tm.tm_mon, &m_tm.tm_mday, &rd);
                src+=rd;
                float secfracsf;

                rd = 0;
                sscanf(src, " %2d:%2d%n", &m_tm.tm_hour, &m_tm.tm_min, &rd);
                if(rd)
                 src+=rd;

                rd = 0;
                sscanf(src, ":%2d%n", &m_tm.tm_sec, &rd);
                if(rd)
                 src+=rd;

                uint64_t secfracs;

                // lossless format is appended in parentheses?
                //  => take it directly from there
                if(skip_fmt(&src, "%*f (%n"))
                {
                    sscanf(src, " ... + 0x%8"PRIx64"p-32 s )%n",
                           &secfracs, &rd);
                    src += rd;
                }
                // float number, but not lossless?
                //  => convert it to fractions of seconds
                else if(*src == '.')
                {
                    sscanf(src, "%f%n", &secfracsf, &rd);
                    src += rd;

                    secfracs = rtosc_float2secfracs(secfracsf);
                }
                else
                {
                    // no fractional / floating seconds part
                    secfracs = 0;
                }

                // posix adjustments
                m_tm.tm_year -= 1900;
                --m_tm.tm_mon;
                rtosc_arg_val_from_params(arg, &m_tm, secfracs);
            }
            else
            {
                char bytes16[16];
                char type = arg->type = 0;

                bool repeat_once = false;
                do
                {
                    rd = 0;

                    const char *fmtstr = scanf_fmtstr_scan(src, bytes16,
                                                           &type);
                    if(!arg->type) // the first occurrence determines the type
                     arg->type = type;

                    switch(type)
                    {
                        case 'h':
                            sscanf(src, fmtstr, &arg->val.h, &rd); break;
                        case 'i':
                            sscanf(src, fmtstr, &arg->val.i, &rd); break;
                        case 'f':
                            sscanf(src, fmtstr, &arg->val.f, &rd); break;
                        case 'd':
                            sscanf(src, fmtstr, &arg->val.d, &rd); break;
                    }
                    src += rd;

                    if(repeat_once)
                    {
                        // we have read the lossless part. skip spaces and ')'
                        skip_fmt(&src, " )%n");
                        repeat_once = false;
                    }
                    else
                    {
                        // is a lossless part appended in parentheses?
                        const char* after_num = src;
                        skip_while(&after_num, isspace);
                        if(*after_num == '(') {
                            ++after_num;
                            skip_while(&after_num, isspace);
                            src = after_num;
                            repeat_once = true;
                        }
                    }
                } while(repeat_once);
            } // date vs integer
        // case ident
    } // switch

    // is the argument being followed by an ellipsis?
    const char* src2 = src;
    for(; isspace(*src2); ++src2) ;

    if(follow_ellipsis && !strncmp(src2, "...", 3))
    {
        src = src2;
        rtosc_arg_val_t delta, rhs;
        size_t zero;

        // lhsarg has already been read
        rtosc_arg_val_t lhsarg = *arg;

        // skip ellipsis and read rhs
        src += 2;
        while(isspace(*++src)) ;

        int infinite_range = (*src == ']');

        if(!infinite_range)
            src += rtosc_scan_arg_val(src, &rhs, 1, NULL, &zero, 0, 0);

        /*
            these shall be conforming to delta_from_arg_vals,
            i.e. if ranges,    the last elements of the ranges
                 if no ranges, the elements themselves
         */
        // find llhs position
        rtosc_arg_val_t tmp;
        // argument "-2" could be a delta arg
        rtosc_arg_val_t* llhsarg = (args_before > 2 &&
                                    arg[-3].type == '-' &&
                                    rtosc_av_rep_has_delta(arg-3))
                      // -2 is a delta arg (following a range arg)?
                      ? rtosc_arg_val_range_arg(arg-3, rtosc_av_rep_num(arg-3)-1,
                                                &tmp)
                      : (args_before > 1 && arg[-2].type == '-')
                      // -2 is a range arg (without delta)?
                      ? arg-1
                      : arg-1; // normal case

        bool llhsarg_is_useless =
            (args_before < 1 ||
            lhsarg.type == '-' || !types_match(llhsarg->type, lhsarg.type)
            /* this includes llhsarg == '-' */
            || !rtosc_arg_vals_cmp_single(llhsarg, &lhsarg, NULL));


        bool has_delta = true;
        int32_t num;
        if(infinite_range && llhsarg_is_useless)
        {
            has_delta = false;
            num = 0; // suppress compiler warnings
        }
        else
        {
            num = delta_from_arg_vals(llhsarg, &lhsarg,
                                      infinite_range ? NULL : &rhs,
                                      &delta, llhsarg_is_useless);

            assert(infinite_range || num > 0);
            if(infinite_range && num == -1)
            {
                has_delta = false;
            }
        }

        insert_arg_range(arg, num, &lhsarg, has_delta, &delta, true, true);
    }

    return (size_t)(src-start);
}